

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O3

RelationalKind mathiu::impl::invertRelational(RelationalKind relKind)

{
  RelationalKind RVar1;
  runtime_error *this;
  code *pcVar2;
  undefined *puVar3;
  
  switch(relKind) {
  case kEQUAL:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              ((logic_error *)this,"Unsupported relational : == in invertRelational!");
    puVar3 = &std::logic_error::typeinfo;
    pcVar2 = std::logic_error::~logic_error;
    goto LAB_00198662;
  case kLESS:
    RVar1 = kGREATER;
    break;
  case kLESS_EQUAL:
    RVar1 = kGREATER_EQUAL;
    break;
  case kGREATER:
    RVar1 = kLESS;
    break;
  case kGREATER_EQUAL:
    RVar1 = kLESS_EQUAL;
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Missing case!");
    puVar3 = &std::runtime_error::typeinfo;
    pcVar2 = std::runtime_error::~runtime_error;
LAB_00198662:
    __cxa_throw(this,puVar3,pcVar2);
  }
  return RVar1;
}

Assistant:

auto invertRelational(RelationalKind relKind) -> RelationalKind
    {
        switch (relKind)
        {
        case RelationalKind::kLESS:
            return RelationalKind::kGREATER;
        case RelationalKind::kLESS_EQUAL:
            return RelationalKind::kGREATER_EQUAL;
        case RelationalKind::kGREATER_EQUAL:
            return RelationalKind::kLESS_EQUAL;
        case RelationalKind::kGREATER:
            return RelationalKind::kLESS;
        case RelationalKind::kEQUAL:
            throw std::logic_error{"Unsupported relational : == in invertRelational!"};
        }
        throw std::runtime_error("Missing case!");
    }